

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O2

size_t re2c::find_state(nfa_state_t **kernel,nfa_state_t **end,ord_hash_set_t *kernels)

{
  nfa_state_t **p;
  nfa_state_t **ppnVar1;
  size_t sVar2;
  
  ppnVar1 = kernel;
  if (kernel == end) {
    return 0xffffffffffffffff;
  }
  for (; ppnVar1 != end; ppnVar1 = ppnVar1 + 1) {
    (*ppnVar1)->mark = false;
  }
  std::__sort<re2c::nfa_state_t**,__gnu_cxx::__ops::_Iter_less_iter>(kernel,end);
  sVar2 = ord_hash_set_t::insert(kernels,kernel,(long)end - (long)kernel);
  return sVar2;
}

Assistant:

static size_t find_state
	( nfa_state_t **kernel
	, nfa_state_t **end
	, ord_hash_set_t &kernels
	)
{
	// zero-sized kernel corresponds to default state
	if (kernel == end)
	{
		return dfa_t::NIL;
	}

	// see note [marking DFA states]
	for (nfa_state_t **p = kernel; p != end; ++p)
	{
		(*p)->mark = false;
	}

	// sort kernel states: we need this to get stable hash
	// and to compare states with simple 'memcmp'
	std::sort(kernel, end);
	const size_t size = static_cast<size_t>(end - kernel) * sizeof(nfa_state_t*);
	return kernels.insert(kernel, size);
}